

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWArray.h
# Opt level: O1

void __thiscall
COLLADAFW::Array<COLLADAFW::TextureCoordinateBinding>::releaseMemory
          (Array<COLLADAFW::TextureCoordinateBinding> *this)

{
  long *plVar1;
  TextureCoordinateBinding *pTVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  
  pTVar2 = this->mData;
  if (pTVar2 != (TextureCoordinateBinding *)0x0) {
    lVar3 = *(long *)((long)&pTVar2[-1].mSemantic.field_2 + 8);
    if (lVar3 != 0) {
      lVar5 = lVar3 * 0x38;
      do {
        plVar1 = (long *)((long)pTVar2 + lVar5 + -0x10);
        *(undefined ***)((long)&pTVar2[-1]._vptr_TextureCoordinateBinding + lVar5) =
             &PTR__TextureCoordinateBinding_009dc158;
        plVar4 = *(long **)((long)pTVar2 + lVar5 + -0x20);
        if (plVar1 != plVar4) {
          operator_delete(plVar4,*plVar1 + 1);
        }
        lVar5 = lVar5 + -0x38;
      } while (lVar5 != 0);
    }
    operator_delete__((void *)((long)&pTVar2[-1].mSemantic.field_2 + 8),lVar3 * 0x38 + 8);
  }
  this->mData = (TextureCoordinateBinding *)0x0;
  this->mCount = 0;
  this->mCapacity = 0;
  return;
}

Assistant:

virtual void releaseMemory ()
        {
            delete[] mData;
            setData ( 0, 0, 0 );
        }